

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O2

void pnga_copy(Integer g_a,Integer g_b)

{
  int iVar1;
  Integer IVar2;
  Integer IVar3;
  Integer IVar4;
  Integer IVar5;
  logical lVar6;
  long icode;
  Integer grp_id;
  char *ptr_a;
  Integer local_4b0;
  int local_4a4;
  Integer local_4a0;
  Integer ndim;
  Integer local_490;
  Integer local_488;
  Integer local_480;
  Integer local_478;
  Integer ndimb;
  Integer typeb;
  Integer type;
  Integer _hi [7];
  Integer _lo [7];
  Integer _ld [6];
  Integer _dims [7];
  Integer dimsb [7];
  _iterator_hdl hdl;
  
  iVar1 = _ga_sync_begin;
  local_4a4 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  IVar2 = pnga_get_pgroup(g_a);
  IVar3 = pnga_get_pgroup(g_b);
  local_490 = pnga_pgroup_nodeid(IVar2);
  local_480 = pnga_pgroup_nodeid(IVar3);
  IVar4 = pnga_get_pgroup_size(IVar2);
  local_4b0 = pnga_get_pgroup_size(IVar3);
  pnga_total_blocks(g_a);
  pnga_total_blocks(g_b);
  if (iVar1 != 0) {
    grp_id = IVar2;
    if (((local_4b0 < IVar4) && (IVar5 = pnga_pgroup_get_world(), grp_id = IVar3, IVar2 == IVar5))
       && (IVar5 = pnga_pgroup_get_world(), IVar3 == IVar5)) {
      pnga_sync();
    }
    else {
      pnga_pgroup_sync(grp_id);
    }
  }
  local_488 = IVar3;
  if (g_a == g_b) {
    pnga_error("arrays have to be different ",0);
  }
  pnga_inquire(g_a,&type,&ndim,_dims);
  pnga_inquire(g_b,&typeb,&ndimb,dimsb);
  if (type != typeb) {
    pnga_error("types not the same",g_b);
  }
  if (ndim != ndimb) {
    pnga_error("dimensions not the same",ndimb);
  }
  for (icode = 0; icode < ndim; icode = icode + 1) {
    if (_dims[icode] != dimsb[icode]) {
      pnga_error("dimensions not the same",icode);
    }
  }
  lVar6 = pnga_is_mirrored(g_a);
  local_4a0 = IVar2;
  local_478 = IVar4;
  if (((lVar6 == 0) || (lVar6 = pnga_is_mirrored(g_b), lVar6 == 0)) &&
     ((lVar6 = pnga_is_mirrored(g_a), lVar6 != 0 || (lVar6 = pnga_is_mirrored(g_b), lVar6 != 0)))) {
    lVar6 = pnga_is_mirrored(g_a);
    if (lVar6 == 0) {
      pnga_zero(g_b);
      pnga_distribution(g_a,local_490,_lo,_hi);
      if (0 < _lo[0]) {
        pnga_access_ptr(g_a,_lo,_hi,&ptr_a,_ld);
        pnga_put(g_b,_lo,_hi,ptr_a,_ld);
      }
      pnga_merge_mirrored(g_b);
    }
    else {
      pnga_distribution(g_b,local_480,_lo,_hi);
      if (0 < _lo[0]) {
        pnga_access_ptr(g_b,_lo,_hi,&ptr_a,_ld);
        pnga_get(g_a,_lo,_hi,ptr_a,_ld);
      }
    }
  }
  else if (local_4b0 < IVar4) {
    pnga_local_iterator_init(g_b,&hdl);
    while (iVar1 = pnga_local_iterator_next(&hdl,_lo,_hi,&ptr_a,_ld), iVar1 != 0) {
      pnga_get(g_a,_lo,_hi,ptr_a,_ld);
    }
  }
  else {
    pnga_local_iterator_init(g_a,&hdl);
    while (iVar1 = pnga_local_iterator_next(&hdl,_lo,_hi,&ptr_a,_ld), iVar1 != 0) {
      pnga_put(g_b,_lo,_hi,ptr_a,_ld);
    }
  }
  if (local_4a4 != 0) {
    IVar2 = local_4a0;
    if (((local_4b0 < local_478) &&
        (IVar3 = pnga_pgroup_get_world(), IVar2 = local_488, local_4a0 == IVar3)) &&
       (IVar3 = pnga_pgroup_get_world(), IVar2 == IVar3)) {
      pnga_sync();
    }
    else {
      pnga_pgroup_sync(IVar2);
    }
  }
  return;
}

Assistant:

void pnga_copy(Integer g_a, Integer g_b)
{
Integer  ndim, ndimb, type, typeb, me_a, me_b;
Integer dimsb[MAXDIM],i;
Integer a_grp, b_grp, anproc, bnproc;
Integer num_blocks_a, num_blocks_b;
Integer blocks[MAXDIM], block_dims[MAXDIM];
char *ptr_a, *ptr_b;
int local_sync_begin,local_sync_end,use_put;
_iterator_hdl hdl;


   Integer _dims[MAXDIM];
   Integer _ld[MAXDIM-1];
   Integer _lo[MAXDIM];
   Integer _hi[MAXDIM];
   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   a_grp = pnga_get_pgroup(g_a);
   b_grp = pnga_get_pgroup(g_b);
   me_a = pnga_pgroup_nodeid(a_grp);
   me_b = pnga_pgroup_nodeid(b_grp);
   anproc = pnga_get_pgroup_size(a_grp);
   bnproc = pnga_get_pgroup_size(b_grp);
   num_blocks_a = pnga_total_blocks(g_a);
   num_blocks_b = pnga_total_blocks(g_b);
   if (anproc <= bnproc) {
     use_put = 1;
   } else {
     use_put = 0;
   }
   /*if (a_grp != b_grp)
     pnga_error("Both arrays must be defined on same group",0L); */
   if(local_sync_begin) {
     if (anproc <= bnproc) {
       pnga_pgroup_sync(a_grp);
     } else if (a_grp == pnga_pgroup_get_world() &&
                b_grp == pnga_pgroup_get_world()) {
       pnga_sync();
     } else {
       pnga_pgroup_sync(b_grp);
     }
   }

   if(g_a == g_b) pnga_error("arrays have to be different ", 0L);

   pnga_inquire(g_a,  &type, &ndim, _dims);
   pnga_inquire(g_b,  &typeb, &ndimb, dimsb);

   if(type != typeb) pnga_error("types not the same", g_b);
   if(ndim != ndimb) pnga_error("dimensions not the same", ndimb);

   for(i=0; i< ndim; i++)if(_dims[i]!=dimsb[i]) 
                          pnga_error("dimensions not the same",i);

   if ((pnga_is_mirrored(g_a) && pnga_is_mirrored(g_b)) ||
       (!pnga_is_mirrored(g_a) && !pnga_is_mirrored(g_b))) {
     /* Both global arrays are mirrored or both global arrays are not mirrored.
        Copy operation is straightforward */

     if (use_put) {
#if 0
       if (num_blocks_a < 0) {
         pnga_distribution(g_a, me_a, _lo, _hi);
         if(_lo[0]>0){
           pnga_access_ptr(g_a, _lo, _hi, &ptr_a, _ld);
           pnga_put(g_b, _lo, _hi, ptr_a, _ld);
         }
       } else {
         if (!pnga_uses_proc_grid(g_a)) {
           for (i=me_a; i<num_blocks_a; i += anproc) {
             pnga_distribution(g_a, i, _lo, _hi);
             if (_lo[0]>0) {
               pnga_access_block_ptr(g_a, i, &ptr_a, _ld);
               pnga_put(g_b, _lo, _hi, ptr_a, _ld);
             }
           }
         } else {
           Integer proc_index[MAXDIM], index[MAXDIM];
           Integer topology[MAXDIM], chk;
           pnga_get_proc_index(g_a, me_a, proc_index);
           pnga_get_proc_index(g_a, me_a, index);
           pnga_get_block_info(g_a, blocks, block_dims);
           pnga_get_proc_grid(g_a, topology);
           while (index[ndim-1] < blocks[ndim-1]) {
             /* find bounding coordinates of block */
             chk = 1;
             for (i = 0; i < ndim; i++) {
               _lo[i] = index[i]*block_dims[i]+1;
               _hi[i] = (index[i] + 1)*block_dims[i];
               if (_hi[i] > _dims[i]) _hi[i] = _dims[i];
               if (_hi[i] < _lo[i]) chk = 0;
             }
             if (chk) {
               pnga_access_block_grid_ptr(g_a, index, &ptr_a, _ld);
               pnga_put(g_b, _lo, _hi, ptr_a, _ld);
             }
             /* increment index to get next block on processor */
             index[0] += topology[0];
             for (i = 0; i < ndim; i++) {
               if (index[i] >= blocks[i] && i<ndim-1) {
                 index[i] = proc_index[i];
                 index[i+1] += topology[i+1];
               }
             }
           }
         }
       }
#else
       pnga_local_iterator_init(g_a, &hdl);
       while (pnga_local_iterator_next(&hdl,_lo,_hi,&ptr_a,_ld)) {
         pnga_put(g_b, _lo, _hi, ptr_a, _ld);
       }
#endif
     } else {
#if 0
       if (num_blocks_b < 0) {
         pnga_distribution(g_b, me_b, _lo, _hi);
         if(_lo[0]>0){
           pnga_access_ptr(g_b, _lo, _hi, &ptr_b, _ld);
           pnga_get(g_a, _lo, _hi, ptr_b, _ld);
         }
       } else {
         if (!pnga_uses_proc_grid(g_a)) {
           for (i=me_b; i<num_blocks_b; i += bnproc) {
             pnga_distribution(g_b, i, _lo, _hi);
             if (_lo[0]>0) {
               pnga_access_block_ptr(g_b, i, &ptr_b, _ld);
               pnga_get(g_a, _lo, _hi, ptr_b, _ld);
             }
           }
         } else {
           Integer proc_index[MAXDIM], index[MAXDIM];
           Integer topology[MAXDIM], chk;
           pnga_get_proc_index(g_b, me_b, proc_index);
           pnga_get_proc_index(g_b, me_b, index);
           pnga_get_block_info(g_b, blocks, block_dims);
           pnga_get_proc_grid(g_b, topology);
           while (index[ndim-1] < blocks[ndim-1]) {
             /* find bounding coordinates of block */
             chk = 1;
             for (i = 0; i < ndim; i++) {
               _lo[i] = index[i]*block_dims[i]+1;
               _hi[i] = (index[i] + 1)*block_dims[i];
               if (_hi[i] > _dims[i]) _hi[i] = _dims[i];
               if (_hi[i] < _lo[i]) chk = 0;
             }
             if (chk) {
               pnga_access_block_grid_ptr(g_b, index, &ptr_b, _ld);
               pnga_get(g_a, _lo, _hi, ptr_b, _ld);
             }
             /* increment index to get next block on processor */
             index[0] += topology[0];
             for (i = 0; i < ndim; i++) {
               if (index[i] >= blocks[i] && i<ndim-1) {
                 index[i] = proc_index[i];
                 index[i+1] += topology[i+1];
               }
             }
           }
         }
       }
#else
       pnga_local_iterator_init(g_b, &hdl);
       while (pnga_local_iterator_next(&hdl,_lo,_hi,&ptr_b,_ld)) {
         pnga_get(g_a, _lo, _hi, ptr_b, _ld);
       }
#endif
     }
   } else {
     /* One global array is mirrored and the other is not */
     if (pnga_is_mirrored(g_a)) {
       /* Source array is mirrored and destination
          array is distributed. Assume source array is consistent */
       pnga_distribution(g_b, me_b, _lo, _hi);
       if (_lo[0]>0) {
         pnga_access_ptr(g_b, _lo, _hi, &ptr_b, _ld);
         pnga_get(g_a, _lo, _hi, ptr_b, _ld);
       } 
     } else {
       /* source array is distributed and destination
          array is mirrored */
       pnga_zero(g_b);
       pnga_distribution(g_a, me_a, _lo, _hi);
       if (_lo[0] > 0) {
         pnga_access_ptr(g_a, _lo, _hi, &ptr_a, _ld);
         pnga_put(g_b, _lo, _hi, ptr_a, _ld);
       }
       pnga_merge_mirrored(g_b);
     }
   }

   if(local_sync_end) {
     if (anproc <= bnproc) {
       pnga_pgroup_sync(a_grp);
     } else if (a_grp == pnga_pgroup_get_world() &&
                b_grp == pnga_pgroup_get_world()) {
       pnga_sync();
     } else {
       pnga_pgroup_sync(b_grp);
     }
   }
}